

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_property.c
# Opt level: O3

int mpt_text_get(mpt_text *tx,mpt_property *pr)

{
  float fVar1;
  char cVar2;
  char *pcVar3;
  size_t sVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  undefined8 *puVar11;
  long lVar12;
  anon_struct_32_4_477a277c *paVar13;
  char *elem_name [7];
  undefined8 local_68 [8];
  
  puVar11 = local_68;
  if (pr == (mpt_property *)0x0) {
    if (mpt_text_pointer_typeid::ptype != 0) {
      return mpt_text_pointer_typeid::ptype;
    }
    iVar9 = mpt_type_add(&mpt_text_pointer_typeid::traits);
    if (0 < iVar9) {
      mpt_text_pointer_typeid::ptype = iVar9;
      return iVar9;
    }
    return iVar9;
  }
  pcVar3 = pr->name;
  if (pcVar3 == (char *)0x0) {
    uVar8 = *(uint *)&pr->desc;
    if (6 < uVar8) {
      return -1;
    }
  }
  else {
    cVar2 = *pcVar3;
    if (cVar2 == '\0') {
      pr->name = "text";
      pr->desc = "mpt text data";
      (pr->val)._addr = mpt_text_get::format;
      (pr->val)._type = 0;
      if ((mpt_text_get::format[2] == '\0') && (iVar9 = mpt_color_typeid(), iVar9 - 1U < 0xff)) {
        mpt_text_get::format[2] = (uint8_t)iVar9;
      }
      if (tx == (mpt_text *)0x0) {
        return 0;
      }
      iVar9 = bcmp(tx,&def_text,0x28);
      return (uint)(iVar9 != 0);
    }
    if (pcVar3[1] == '\0') {
      if (cVar2 == 'y') {
        paVar13 = mpt_text_get::elem_xy + 1;
      }
      else {
        if (cVar2 != 'x') {
          return -1;
        }
        paVar13 = mpt_text_get::elem_xy;
      }
      if (tx == (mpt_text *)0x0) {
        iVar9 = 0;
      }
      else {
        fVar1 = (tx->pos).x;
        iVar9 = 100;
        if (fVar1 != 0.5) {
          iVar9 = 0;
        }
        if (NAN(fVar1)) {
          iVar9 = 0;
        }
      }
      pcVar3 = paVar13->desc;
      pr->name = paVar13->name;
      pr->desc = pcVar3;
      (pr->val)._addr = (void *)((long)&tx->_value + paVar13->off);
      (pr->val)._type = (long)paVar13->type;
      return iVar9;
    }
    lVar12 = 0;
    do {
      *puVar11 = *(undefined8 *)((long)&mpt_text_get::elem[0].name + lVar12);
      puVar11 = puVar11 + 1;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0xe0);
    uVar8 = mpt_property_match(pcVar3,0xffffffff,local_68,7);
    if ((int)uVar8 < 0) {
      return uVar8;
    }
  }
  iVar9 = mpt_text_get::elem[uVar8].type;
  if ((long)iVar9 < 0) {
    if (iVar9 == -2) {
      iVar10 = mpt_fpoint_typeid();
    }
    else {
      if (iVar9 != -1) {
        return -1;
      }
      iVar10 = mpt_color_typeid();
    }
    if (iVar10 < 1) {
      return -4;
    }
  }
  uVar5 = *(undefined4 *)((long)&mpt_text_get::elem[uVar8].name + 4);
  uVar6 = *(undefined4 *)&mpt_text_get::elem[uVar8].desc;
  uVar7 = *(undefined4 *)((long)&mpt_text_get::elem[uVar8].desc + 4);
  *(undefined4 *)&pr->name = *(undefined4 *)&mpt_text_get::elem[uVar8].name;
  *(undefined4 *)((long)&pr->name + 4) = uVar5;
  *(undefined4 *)&pr->desc = uVar6;
  *(undefined4 *)((long)&pr->desc + 4) = uVar7;
  sVar4 = mpt_text_get::elem[uVar8].off;
  (pr->val)._addr = (void *)((long)&tx->_value + sVar4);
  (pr->val)._type = (long)iVar9;
  if (tx == (mpt_text *)0x0) {
    return 0;
  }
  iVar9 = mpt_value_compare(&pr->val,(long)&def_text._value + sVar4);
  return iVar9;
}

Assistant:

extern int mpt_text_get(const MPT_STRUCT(text) *tx, MPT_STRUCT(property) *pr)
{
	static const struct {
		const char  *name;
		const char  *desc;
		const int    type;
		const size_t off;
	} elem[] = {
		{"color",  "text color",     -1,  MPT_offset(text,color) },
		
		{"pos",    "text position",  -2,  MPT_offset(text, pos) },
		
		{"size",   "text size",      'y', MPT_offset(text,size) },
		{"align",  "text alignment", 'c', MPT_offset(text,align) },
		{"angle",  "text angle",     'd', MPT_offset(text,angle) },
		{"value",  "text data",      's', MPT_offset(text,_value) },
		{"font",   "text font",      's', MPT_offset(text,_font) },
	},
	elem_xy[] = {
		{"x", "x start position", 'f',  MPT_offset(text, pos.x) },
		{"y", "y start position", 'f',  MPT_offset(text, pos.y) }
	},
	*from;
	static uint8_t format[] = {
		's', 's',       /* value, font */
		0,              /* placeholder for dynamic color ID */
		'y', 'y', 'y',  /* font style, weight, size, */
		'c',            /* text alignment */
		'f', 'f',       /* position */
		'd',            /* angle */
		0
	};
	int type;
	int pos;
	
	if (!pr) {
		return mpt_text_pointer_typeid();
	}
	/* property by position */
	if (!pr->name) {
		pos = (intptr_t) pr->desc;
		if (pos < 0 || pos >= (int) MPT_arrsize(elem)) {
			return MPT_ERROR(BadArgument);
		}
	}
	/* get total type */
	else if (!*pr->name) {
		pr->name = "text";
		pr->desc = "mpt text data";
		MPT_value_set(&pr->val, 0, format);
		
		if (!format[2] && (type = mpt_color_typeid()) > 0 && type <= UINT8_MAX) {
			format[2] = type;
		}
		return tx && memcmp(tx, &def_text, sizeof(*tx)) ? 1 : 0;
	}
	/* set position independently */
	else if (!pr->name[1]) {
		if (pr->name[0] == 'x') {
			from = &elem_xy[0];
			pos = (tx && tx->pos.x == def_text.pos.x) ? 'd' : 0;
		}
		else if (pr->name[0] == 'y') {
			from = &elem_xy[1];
			pos = (tx && tx->pos.x == def_text.pos.x) ? 'd' : 0;
		}
		else {
			return MPT_ERROR(BadArgument);
		}
		
		pr->name = from->name;
		pr->desc = from->desc;
		
		MPT_value_set(&pr->val, from->type, ((uint8_t *) tx) + from->off);
		
		return pos;
	}
	/* find property by name */
	else {
		const char *elem_name[MPT_arrsize(elem)];
		for (pos = 0; pos < (int) MPT_arrsize(elem); pos++) {
			elem_name[pos] = elem[pos].name;
		}
		if ((pos = mpt_property_match(pr->name, -1, elem_name, pos)) < 0) {
			return pos;
		}
	}
	if ((type = elem[pos].type) < 0) {
		int type = elem[pos].type;
		if (type == -1) {
			if ((type = mpt_color_typeid()) <= 0) {
				return MPT_ERROR(BadOperation);
			}
		}
		else if (type == -2) {
			if ((type = mpt_fpoint_typeid()) <= 0) {
				return MPT_ERROR(BadOperation);
			}
		}
		else {
			return MPT_ERROR(BadArgument);
		}
	}
	
	pr->name = elem[pos].name;
	pr->desc = elem[pos].desc;
	MPT_value_set(&pr->val, type, ((uint8_t *) tx) + elem[pos].off);
	
	if (!tx) {
		return 0;
	}
	return mpt_value_compare(&pr->val, ((uint8_t *) &def_text) + elem[pos].off);
}